

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::btBvhTriangleMeshShape
          (btBvhTriangleMeshShape *this,btStridingMeshInterface *meshInterface,
          bool useQuantizedAabbCompression,bool buildBvh)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  btTriangleMeshShape *in_RSI;
  undefined8 *in_RDI;
  btBvhTriangleMeshShape *unaff_retaddr;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  bVar1 = in_CL & 1;
  btTriangleMeshShape::btTriangleMeshShape
            (in_RSI,(btStridingMeshInterface *)
                    (CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe8)) & 0x101ffffffffffff))
  ;
  *in_RDI = &PTR__btBvhTriangleMeshShape_002e3d38;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  *(byte *)(in_RDI + 0xb) = bVar2 & 1;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  *(undefined4 *)(in_RDI + 1) = 0x15;
  if ((bVar1 & 1) != 0) {
    buildOptimizedBvh(unaff_retaddr);
  }
  return;
}

Assistant:

btBvhTriangleMeshShape::btBvhTriangleMeshShape(btStridingMeshInterface* meshInterface, bool useQuantizedAabbCompression, bool buildBvh)
:btTriangleMeshShape(meshInterface),
m_bvh(0),
m_triangleInfoMap(0),
m_useQuantizedAabbCompression(useQuantizedAabbCompression),
m_ownsBvh(false)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	//construct bvh from meshInterface
#ifndef DISABLE_BVH

	if (buildBvh)
	{
		buildOptimizedBvh();
	}

#endif //DISABLE_BVH

}